

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.c
# Opt level: O2

int nsync::counter_dequeue(void *v,nsync_waiter_s *nw)

{
  int iVar1;
  nsync_dll_list_ pnVar2;
  
  nsync_mu_lock((nsync_mu *)((long)v + 8));
  iVar1 = *(int *)((long)v + 0x18);
  if ((nw->waiting).super___atomic_base<unsigned_int>._M_i != 0) {
    pnVar2 = nsync_dll_remove_(*(nsync_dll_list_ *)((long)v + 0x20),&nw->q);
    *(nsync_dll_list_ *)((long)v + 0x20) = pnVar2;
    (nw->waiting).super___atomic_base<unsigned_int>._M_i = 0;
  }
  nsync_mu_unlock((nsync_mu *)((long)v + 8));
  return (int)(iVar1 != 0);
}

Assistant:

static int counter_dequeue (void *v, struct nsync_waiter_s *nw) {
	nsync_counter c = (nsync_counter) v;
	int32_t value;
	nsync_mu_lock (&c->counter_mu);
	value = ATM_LOAD_ACQ (&c->value);
	if (ATM_LOAD_ACQ (&nw->waiting) != 0) {
		c->waiters = nsync_dll_remove_ (c->waiters, &nw->q);
		ATM_STORE (&nw->waiting, 0);
	}
	nsync_mu_unlock (&c->counter_mu);
	return (value != 0);
}